

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mygrep.c
# Opt level: O1

int main(int argc,char **argv)

{
  char *key;
  byte bVar1;
  int iVar2;
  FILE *pFVar3;
  long lVar4;
  byte bVar5;
  long lVar6;
  byte local_42;
  Settings local_40;
  
  name = *argv;
  local_40.output = (FILE *)_stdout;
  bVar5 = local_40._0_1_ | 1;
  pFVar3 = _stdout;
  bVar1 = local_40._0_1_ & 0xfe;
  local_40._0_1_ = local_40._0_1_ & 0xfe;
  do {
    while (local_42 = bVar1, iVar2 = __posix_getopt(argc,argv,"io:"), iVar2 == 0x6f) {
      if (pFVar3 != _stdout) {
        fclose(pFVar3);
      }
      pFVar3 = fopen(_optarg,"w");
      bVar1 = local_42;
    }
    bVar1 = bVar5;
  } while (iVar2 == 0x69);
  local_40.output = (FILE *)pFVar3;
  if (iVar2 == -1) {
    local_40._0_1_ = local_42;
    if (pFVar3 == (FILE *)0x0) {
      fprintf(_stderr,"%s ERROR:\t",name);
      fwrite("couldn\'t open output file",0x19,1,_stderr);
      fputc(10,_stderr);
      goto LAB_001013c4;
    }
    lVar4 = (long)_optind;
    if (_optind < argc) {
      key = argv[lVar4];
      if (_optind + 1 < argc) {
        iVar2 = argc - _optind;
        lVar6 = 1;
        do {
          pFVar3 = fopen(argv[lVar4 + lVar6],"r");
          handle_file((FILE *)pFVar3,&local_40,key);
          fclose(pFVar3);
          lVar6 = lVar6 + 1;
        } while (iVar2 != (int)lVar6);
      }
      else {
        handle_file(_stdin,&local_40,key);
      }
      exit(0);
    }
  }
  local_40._0_1_ = local_42;
  fprintf(_stdout,"USAGE: %s [-i] [-o outfile] keyword [file...]\n",name);
LAB_001013c4:
  exit(1);
}

Assistant:

int main(int argc, char **argv)
{
	name = argv[0];

	Settings set = {0, stdout};
	int opt;

	while ((opt = getopt(argc, argv, "io:")) != -1)
	{
		switch (opt)
		{
		case 'i':
			set.i = 1;
			break;
		case 'o':
			if (set.output != stdout)
				fclose(set.output);
			set.output = fopen(optarg, "w");
			break;
		default:
			USAGE();
		}
	}

	if (set.output == NULL)
	{
		ERROR_EXIT("couldn't open output file");
	}

	if (optind >= argc)
	{
		USAGE();
	}
	int i = optind;

	char *key = argv[i];

	i++;

	if (i >= argc)
	{
		handle_file(stdin, &set, key);
	}
	else
	{
		for (; i < argc; i++)
		{

			FILE *input = fopen(argv[i], "r");

			handle_file(input, &set, key);
			fclose(input);
		}
	}
	exit(EXIT_SUCCESS);
}